

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O1

uint32_t FAPOBase_IsOutputFormatSupported
                   (FAPOBase *fapo,FAudioWaveFormatEx *pInputFormat,
                   FAudioWaveFormatEx *pRequestedOutputFormat,
                   FAudioWaveFormatEx **ppSupportedOutputFormat)

{
  FAudioWaveFormatEx *pFVar1;
  uint32_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint16_t uVar5;
  
  if (((((pRequestedOutputFormat->wFormatTag != 3) ||
        ((ushort)(pRequestedOutputFormat->nChannels - 0x41) < 0xffc0)) ||
       (pRequestedOutputFormat->nSamplesPerSec - 0x30d41 < 0xfffcf6a7)) ||
      (uVar2 = 0, pRequestedOutputFormat->wBitsPerSample != 0x20)) &&
     (uVar2 = 0x88970001, ppSupportedOutputFormat != (FAudioWaveFormatEx **)0x0)) {
    pFVar1 = *ppSupportedOutputFormat;
    pFVar1->wFormatTag = 3;
    uVar3 = pRequestedOutputFormat->nChannels + (ushort)(pRequestedOutputFormat->nChannels == 0);
    uVar5 = 0x40;
    if (uVar3 < 0x40) {
      uVar5 = uVar3;
    }
    pFVar1->nChannels = uVar5;
    uVar4 = 1000;
    if (1000 < pRequestedOutputFormat->nSamplesPerSec) {
      uVar4 = pRequestedOutputFormat->nSamplesPerSec;
    }
    if (199999 < uVar4) {
      uVar4 = 200000;
    }
    pFVar1->nSamplesPerSec = uVar4;
    pFVar1->wBitsPerSample = 0x20;
  }
  return uVar2;
}

Assistant:

uint32_t FAPOBase_IsOutputFormatSupported(
	FAPOBase *fapo,
	const FAudioWaveFormatEx *pInputFormat,
	const FAudioWaveFormatEx *pRequestedOutputFormat,
	FAudioWaveFormatEx **ppSupportedOutputFormat
) {
	if (	pRequestedOutputFormat->wFormatTag != FAPOBASE_DEFAULT_FORMAT_TAG ||
		pRequestedOutputFormat->nChannels < FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS ||
		pRequestedOutputFormat->nChannels > FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS ||
		pRequestedOutputFormat->nSamplesPerSec < FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE ||
		pRequestedOutputFormat->nSamplesPerSec > FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE ||
		pRequestedOutputFormat->wBitsPerSample != FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE	)
	{
		if (ppSupportedOutputFormat != NULL)
		{
			(*ppSupportedOutputFormat)->wFormatTag =
				FAPOBASE_DEFAULT_FORMAT_TAG;
			(*ppSupportedOutputFormat)->nChannels = FAudio_clamp(
				pRequestedOutputFormat->nChannels,
				FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS,
				FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS
			);
			(*ppSupportedOutputFormat)->nSamplesPerSec = FAudio_clamp(
				pRequestedOutputFormat->nSamplesPerSec,
				FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE,
				FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE
			);
			(*ppSupportedOutputFormat)->wBitsPerSample =
				FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE;
		}
		return FAPO_E_FORMAT_UNSUPPORTED;
	}
	return 0;
}